

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)57,(moira::Mode)8,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Imu<1> im;
  StrWriter *pSVar2;
  Ea<(moira::Mode)8,_1> dst;
  Ea<(moira::Mode)8,_1> local_3c;
  
  im.raw = dasmIncRead<1>(this,addr);
  Op<(moira::Mode)8,1>(&local_3c,this,op & 7,addr);
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  if (SVar1 == MUSASHI) {
    pSVar2 = StrWriter::operator<<(pSVar2,im);
    StrWriter::operator<<(pSVar2);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2,(Ims<1>)im.raw);
    StrWriter::operator<<(pSVar2,",");
  }
  StrWriter::operator<<(pSVar2,&local_3c);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}